

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulate.cpp
# Opt level: O0

void anon_unknown.dwarf_18993::op_adc_decimal_16(EmulateRegisters *regs,uint16_t value)

{
  bool bVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  ushort local_26;
  uint16_t flags_value;
  uint16_t flags_affected;
  uint16_t bcd_result;
  uint32_t sum;
  uint32_t carry;
  uint16_t a_uint;
  uint16_t v_uint;
  uint16_t a16;
  uint16_t value_local;
  EmulateRegisters *regs_local;
  
  uVar2 = snestistics::EmulateRegisters::A(regs,0xffff);
  uVar3 = bcd_to_uint(value);
  uVar4 = bcd_to_uint(uVar2);
  bVar1 = snestistics::EmulateRegisters::P_flag(regs,Carry);
  uVar5 = (uVar4 & 0xffff) + (uVar3 & 0xffff) + (uint)bVar1;
  uVar2 = uint_to_bcd((uint16_t)uVar5);
  local_26 = 0;
  if (uVar2 == 0) {
    local_26 = 2;
  }
  if ((uVar2 & 0x8000) != 0) {
    local_26 = local_26 | 0x80;
  }
  if (0xffff < uVar5) {
    local_26 = local_26 | 1;
  }
  snestistics::EmulateRegisters::set_A(regs,uVar2,0xffff);
  snestistics::EmulateRegisters::set_P(regs,local_26,0xc3);
  return;
}

Assistant:

inline void op_adc_decimal_16(EmulateRegisters &regs, const uint16_t value) {
	const uint16_t a16 = regs.A();

	uint16_t v_uint = bcd_to_uint(value), a_uint=bcd_to_uint(a16);
	const uint32_t carry = regs.P_flag(ProcessorStatusFlag::Carry) == 0 ? 0 : 1;
	uint32_t sum = a_uint + v_uint + carry;

	uint16_t bcd_result = uint_to_bcd(sum);

	const uint16_t flags_affected = 
		(uint16_t)ProcessorStatusFlag::Carry|
		(uint16_t)ProcessorStatusFlag::Negative|
		(uint16_t)ProcessorStatusFlag::Zero|
		(uint16_t)ProcessorStatusFlag::Overflow;

	uint16_t flags_value = 0;

	if ((bcd_result&0xFFFF) == 0) flags_value |= (uint16_t)ProcessorStatusFlag::Zero;
	if (bcd_result & 0x8000) flags_value |= (uint16_t)ProcessorStatusFlag::Negative;
	if (sum >= 0x10000) flags_value |= (uint16_t)ProcessorStatusFlag::Carry; // Not quite right

	// TODO: Set overflow

	regs.set_A(bcd_result);
	regs.set_P(flags_value, flags_affected);
}